

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
accept<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>>,mpl_::bool_<true>>
          (xpression_peeker<char> *this,
          simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::basic_chset<char>_>_>,_mpl_::bool_<true>_>
          *xpr)

{
  int iVar1;
  
  if (xpr->width_ == 1) {
    iVar1 = this->leading_simple_repeat_;
    this->leading_simple_repeat_ = iVar1 + 1;
    xpr->leading_ = -1 < iVar1;
  }
  if (xpr->min_ != 0) {
    accept<mpl_::bool_<true>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (this,(charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_boost::xpressive::detail::basic_chset<char>_>
                     *)xpr);
    return;
  }
  hash_peek_bitset<char>::set_all(this->bset_);
  return;
}

Assistant:

mpl::false_ accept(simple_repeat_matcher<Xpr, Greedy> const &xpr)
    {
        if(Greedy() && 1U == xpr.width_)
        {
            ++this->leading_simple_repeat_;
            xpr.leading_ = this->leading_simple_repeat();
        }
        0 != xpr.min_ ? xpr.xpr_.peek(*this) : this->fail(); // could be a union of xpr and next
        return mpl::false_();
    }